

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepExamples.cpp
# Opt level: O2

void writeDeepScanlineFile
               (char *filename,Box2i *displayWindow,Box2i *dataWindow,Array2D<float_*> *dataZ,
               Array2D<Imath_3_2::half_*> *dataA,Array2D<unsigned_int> *sampleCount)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  undefined4 *puVar7;
  long lVar8;
  void *pvVar9;
  int i;
  int j;
  long lVar10;
  int i_1;
  int j_1;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long local_140;
  DeepScanLineOutputFile file;
  Header header;
  DeepFrameBuffer frameBuffer;
  Slice local_68 [56];
  
  iVar1 = (dataWindow->max).y;
  iVar2 = (dataWindow->min).y;
  iVar3 = (dataWindow->max).x;
  iVar4 = (dataWindow->min).x;
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,&header);
  pcVar6 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&frameBuffer,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar6,(Channel *)0x112763);
  pcVar6 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&frameBuffer,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar6,(Channel *)0x112769);
  Imf_3_4::Header::setType((string *)&header);
  puVar7 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar7 = 2;
  iVar5 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile(&file,filename,&header,iVar5);
  Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  lVar13 = (long)iVar3 - (long)iVar4;
  lVar8 = (long)(int)lVar13 + 1;
  lVar11 = (long)(int)lVar8;
  Imf_3_4::Slice::Slice
            (local_68,UINT,
             (char *)(sampleCount->_data +
                     (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar8)),4,lVar11 * 4,1,1,
             0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_68,FLOAT,
             (char *)(dataZ->_data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar11)),8,
             lVar11 * 8,4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)0x112763);
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_68,HALF,
             (char *)(dataA->_data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar11)),8,
             lVar11 * 8,2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)0x112769);
  Imf_3_4::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  lVar11 = (long)iVar1 - (long)iVar2;
  local_140 = 0;
  lVar14 = 0;
  for (lVar8 = 0; lVar8 <= lVar11; lVar8 = lVar8 + 1) {
    for (lVar10 = 0; lVar10 <= lVar13; lVar10 = lVar10 + 1) {
      lVar12 = sampleCount->_sizeY * local_140;
      *(undefined4 *)((long)sampleCount->_data + lVar10 * 4 + lVar12) = 1;
      pvVar9 = operator_new__(4);
      *(void **)((long)dataZ->_data + lVar10 * 8 + dataZ->_sizeY * lVar14) = pvVar9;
      pvVar9 = operator_new__((ulong)*(uint *)((long)sampleCount->_data + lVar10 * 4 + lVar12) * 2);
      *(void **)((long)dataA->_data + lVar10 * 8 + dataA->_sizeY * lVar14) = pvVar9;
      getPixelSampleData((int)lVar8,(int)lVar10,dataZ,dataA);
    }
    Imf_3_4::DeepScanLineOutputFile::writePixels((int)&file);
    lVar14 = lVar14 + 8;
    local_140 = local_140 + 4;
  }
  lVar14 = 0;
  for (lVar8 = 0; lVar8 <= lVar11; lVar8 = lVar8 + 1) {
    for (lVar10 = 0; lVar10 <= lVar13; lVar10 = lVar10 + 1) {
      pvVar9 = *(void **)((long)dataZ->_data + lVar10 * 8 + dataZ->_sizeY * lVar14);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      pvVar9 = *(void **)((long)dataA->_data + lVar10 * 8 + dataA->_sizeY * lVar14);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
    }
    lVar14 = lVar14 + 8;
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_4::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
  Imf_3_4::Header::~Header(&header);
  return;
}

Assistant:

void
writeDeepScanlineFile (
    const char       filename[],
    Box2i            displayWindow,
    Box2i            dataWindow,
    Array2D<float*>& dataZ,

    Array2D<half*>& dataA,

    Array2D<unsigned int>& sampleCount)

{
    //
    // Write a deep image with only a A (alpha) and a Z (depth) channel,
    // using class DeepScanLineOutputFile.
    //
    //    - create a file header
    //    - add A and Z channels to the header
    //    - open the file, and store the header in the file
    //    - describe the memory layout of the A and Z pixels
    //    - store the pixels in the file
    //

    int height = dataWindow.max.y - dataWindow.min.y + 1;
    int width  = dataWindow.max.x - dataWindow.min.x + 1;

    Header header (displayWindow, dataWindow);

    header.channels ().insert ("Z", Channel (FLOAT));
    header.channels ().insert ("A", Channel (HALF));
    header.setType (DEEPSCANLINE);
    header.compression () = ZIPS_COMPRESSION;

    DeepScanLineOutputFile file (filename, header);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        UINT,
        (char*) (&sampleCount[0][0] - dataWindow.min.x -
                 dataWindow.min.y * width),
        sizeof (unsigned int) * 1, // xS

        sizeof (unsigned int) * width)); // yStride

    frameBuffer.insert (
        "Z",
        DeepSlice (
            FLOAT,
            (char*) (&dataZ[0][0] - dataWindow.min.x -
                     dataWindow.min.y * width),
            sizeof (float*) * 1, // xStride for pointer

            sizeof (float*) * width, // yStride for pointer array
            sizeof (float) * 1));    // stride for Z data sample

    frameBuffer.insert (
        "A",
        DeepSlice (
            HALF,
            (char*) (&dataA[0][0] - dataWindow.min.x -
                     dataWindow.min.y * width),
            sizeof (half*) * 1,     // xStride for pointer array
            sizeof (half*) * width, // yStride for pointer array
            sizeof (half) * 1));    // stride for A data sample

    file.setFrameBuffer (frameBuffer);

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            sampleCount[i][j] = getPixelSampleCount (i, j);
            dataZ[i][j]       = new float[sampleCount[i][j]];
            dataA[i][j]       = new half[sampleCount[i][j]];
            // Generate data for dataZ and dataA.
            getPixelSampleData (i, j, dataZ, dataA);
        }

        file.writePixels (1);
    }

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            delete[] dataZ[i][j];
            delete[] dataA[i][j];
        }
    }
}